

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

value_type __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
          (FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_> *this,
          int i)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pdVar5 = &pFVar1->defaultVal;
  if ((pFVar1->dx_).num_elts != 0) {
    pdVar5 = (pFVar1->dx_).ptr_to_data + i;
  }
  pdVar6 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar6 = (pFVar2->dx_).ptr_to_data + i;
  }
  pFVar3 = this->right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  return (*pdVar5 * pFVar2->val_ + *pdVar6 * pFVar1->val_) - *pdVar4;
}

Assistant:

const T& dx(int i) const { return dx_.size() ? dx_[i] : defaultVal;}